

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::focusOutEvent(QGraphicsView *this,QFocusEvent *event)

{
  long lVar1;
  long lVar2;
  QObject *pQVar3;
  
  lVar1 = *(long *)(this + 8);
  QWidget::focusOutEvent((QWidget *)this,event);
  lVar2 = *(long *)(lVar1 + 0x490);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x498) != 0)) {
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = *(QObject **)(lVar1 + 0x498);
    }
    QCoreApplication::sendEvent(pQVar3,(QEvent *)event);
    return;
  }
  return;
}

Assistant:

void QGraphicsView::focusOutEvent(QFocusEvent *event)
{
    Q_D(QGraphicsView);
    QAbstractScrollArea::focusOutEvent(event);
    if (d->scene)
        QCoreApplication::sendEvent(d->scene, event);
}